

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_libc.cc
# Opt level: O1

unique_ptr<absl::lts_20250127::time_internal::cctz::TimeZoneLibC,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneLibC>_>
 __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneLibC::Make(TimeZoneLibC *this,string *name)

{
  int iVar1;
  _func_int **pp_Var2;
  
  pp_Var2 = (_func_int **)operator_new(0x10);
  *pp_Var2 = (_func_int *)&PTR__TimeZoneIf_0035d9c8;
  iVar1 = std::__cxx11::string::compare((char *)name);
  *(bool *)(pp_Var2 + 1) = iVar1 == 0;
  (this->super_TimeZoneIf)._vptr_TimeZoneIf = pp_Var2;
  return (__uniq_ptr_data<absl::lts_20250127::time_internal::cctz::TimeZoneLibC,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneLibC>,_true,_true>
          )(__uniq_ptr_data<absl::lts_20250127::time_internal::cctz::TimeZoneLibC,_std::default_delete<absl::lts_20250127::time_internal::cctz::TimeZoneLibC>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TimeZoneLibC> TimeZoneLibC::Make(const std::string& name) {
  return std::unique_ptr<TimeZoneLibC>(new TimeZoneLibC(name));
}